

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O0

void __thiscall Calculator::setPrintNumBase(Calculator *this,int base)

{
  ostream *this_00;
  exception *e;
  int base_local;
  Calculator *this_local;
  
  if ((base < 2) || (0x24 < base)) {
    this_00 = std::operator<<(this->mOutputStream,"The base must be >= 2 and <= 36.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->mPrintNumBase = base;
  }
  return;
}

Assistant:

void Calculator::setPrintNumBase(int base) {
	try {
		if (base >= 2 && base <= 36) {
			mPrintNumBase = base;
		} else {
			mOutputStream << "The base must be >= 2 and <= 36." << std::endl;
		}
	} catch (std::exception& e) {
		mOutputStream << "The base must be an integer." << std::endl;
	}
}